

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

int * __thiscall
google::protobuf::RepeatedField<int>::AddNAlreadyReserved(RepeatedField<int> *this,int n)

{
  int iVar1;
  int *piVar2;
  int in_ESI;
  RepeatedField<int> *in_RDI;
  int *ret;
  
  piVar2 = unsafe_elements(in_RDI);
  iVar1 = in_RDI->current_size_;
  in_RDI->current_size_ = in_ESI + in_RDI->current_size_;
  return piVar2 + iVar1;
}

Assistant:

inline Element* RepeatedField<Element>::AddNAlreadyReserved(int n) {
  GOOGLE_DCHECK_GE(total_size_ - current_size_, n)
      << total_size_ << ", " << current_size_;
  // Warning: sometimes people call this when n == 0 and total_size_ == 0. In
  // this case the return pointer points to a zero size array (n == 0). Hence
  // we can just use unsafe_elements(), because the user cannot dereference the
  // pointer anyway.
  Element* ret = unsafe_elements() + current_size_;
  current_size_ += n;
  return ret;
}